

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::makeController(MidiMessage *this,int channel,int num,int value)

{
  byte local_1f;
  byte local_1e;
  byte local_1d;
  int local_1c;
  int local_18;
  int value_local;
  int num_local;
  int channel_local;
  MidiMessage *this_local;
  
  local_1c = value;
  local_18 = num;
  value_local = channel;
  _num_local = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  local_1d = (byte)value_local & 0xf | 0xb0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1d);
  local_1e = (byte)local_18 & 0x7f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1e);
  local_1f = (byte)local_1c & 0x7f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1f);
  return;
}

Assistant:

void MidiMessage::makeController(int channel, int num, int value) {
	resize(0);
	push_back(0xb0 | (0x0f & channel));
	push_back(0x7f & num);
	push_back(0x7f & value);
}